

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::EOITestInst<false>::Print
          (EOITestInst<false> *this,DebugWriter *w,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  EOITestInst<false> *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",1);
  }
  DebugWriter::Print(w,L"EOITest");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"<hardFail>: %s",L"false");
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    DebugWriter::Unindent(w);
  }
  return 1;
}

Assistant:

int EOITestInst<canHardFail>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (canHardFail)
        {
            PRINT_RE_BYTECODE_BEGIN("EOIHardFailTest");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("EOITest");
        }

        w->Print(_u("<hardFail>: %s"), canHardFail ? _u("true") : _u("false"));

        PRINT_RE_BYTECODE_MID();
        PRINT_RE_BYTECODE_END();
    }